

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTrace.c
# Opt level: O1

void Sat_SolverTraceWrite(sat_solver *pSat,int *pBeg,int *pEnd,int fRoot)

{
  uint uVar1;
  uint uVar2;
  
  if (pSat->pFile == (FILE *)0x0) {
    return;
  }
  pSat->nClauses = pSat->nClauses + 1;
  pSat->nRoots = pSat->nRoots + fRoot;
  if (pBeg < pEnd) {
    do {
      uVar2 = *pBeg >> 1;
      uVar1 = ~uVar2;
      if ((*pBeg & 1U) == 0) {
        uVar1 = uVar2 + 1;
      }
      fprintf((FILE *)pSat->pFile," %d",(ulong)uVar1);
      pBeg = (int *)((uint *)pBeg + 1);
    } while (pBeg < pEnd);
  }
  fwrite(" 0\n",3,1,(FILE *)pSat->pFile);
  return;
}

Assistant:

void Sat_SolverTraceWrite( sat_solver * pSat, int * pBeg, int * pEnd, int fRoot )
{
    if ( pSat->pFile == NULL )
        return;
    pSat->nClauses++;
    pSat->nRoots += fRoot;
    for ( ; pBeg < pEnd ; pBeg++ )
        fprintf( pSat->pFile, " %d", lit_print(*pBeg) );
    fprintf( pSat->pFile, " 0\n" );
}